

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::Test::HasNonfatalFailure(void)

{
  pointer pTVar1;
  uint uVar2;
  TestResult *pTVar3;
  pointer pTVar4;
  
  UnitTest::GetInstance();
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
    if ((UnitTest::GetInstance::instance.impl_)->current_test_suite_ == (TestSuite *)0x0) {
      pTVar3 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
    }
    else {
      pTVar3 = &(UnitTest::GetInstance::instance.impl_)->current_test_suite_->ad_hoc_test_result_;
    }
  }
  else {
    pTVar3 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
  }
  pTVar4 = (pTVar3->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (pTVar3->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = 0;
  if (pTVar4 != pTVar1) {
    do {
      uVar2 = uVar2 + (pTVar4->type_ == kNonFatalFailure);
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
    uVar2 = (uint)(uVar2 != 0);
  }
  return SUB41(uVar2,0);
}

Assistant:

bool Test::HasNonfatalFailure() {
  return internal::GetUnitTestImpl()
      ->current_test_result()
      ->HasNonfatalFailure();
}